

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

DFA * __thiscall re2::Prog::GetDFA(Prog *this,MatchKind kind)

{
  DFA *this_00;
  int64 local_48;
  int64 m;
  MutexLock local_38;
  MutexLock l;
  DFA *dfa;
  atomic<re2::DFA_*> *pdfa;
  MatchKind kind_local;
  Prog *this_local;
  
  if ((kind == kFirstMatch) || (kind == kManyMatch)) {
    dfa = (DFA *)&this->dfa_first_;
    pdfa._4_4_ = kind;
  }
  else {
    pdfa._4_4_ = kLongestMatch;
    dfa = (DFA *)&this->dfa_longest_;
  }
  l.mu_ = (Mutex *)std::atomic<re2::DFA_*>::load((atomic<re2::DFA_*> *)dfa,memory_order_acquire);
  this_local = (Prog *)l.mu_;
  if ((Prog *)l.mu_ == (Prog *)0x0) {
    MutexLock::MutexLock(&local_38,&this->dfa_mutex_);
    l.mu_ = (Mutex *)std::atomic<re2::DFA_*>::load((atomic<re2::DFA_*> *)dfa,memory_order_relaxed);
    if ((__pointer_type)l.mu_ == (__pointer_type)0x0) {
      local_48 = this->dfa_mem_ / 2;
      if ((this->reversed_ & 1U) != 0) {
        if ((pdfa._4_4_ == kLongestMatch) || (pdfa._4_4_ == kManyMatch)) {
          local_48 = this->dfa_mem_;
        }
        else {
          local_48 = 0;
        }
      }
      this_00 = (DFA *)operator_new(0x170);
      DFA::DFA(this_00,this,pdfa._4_4_,local_48);
      l.mu_ = (Mutex *)this_00;
      std::atomic<re2::DFA_*>::store((atomic<re2::DFA_*> *)dfa,this_00,memory_order_release);
    }
    this_local = (Prog *)l.mu_;
    MutexLock::~MutexLock(&local_38);
  }
  return (DFA *)this_local;
}

Assistant:

DFA* Prog::GetDFA(MatchKind kind) {
  std::atomic<DFA*>* pdfa;
  if (kind == kFirstMatch || kind == kManyMatch) {
    pdfa = &dfa_first_;
  } else {
    kind = kLongestMatch;
    pdfa = &dfa_longest_;
  }

  // Quick check.
  DFA* dfa = pdfa->load(std::memory_order_acquire);
  if (dfa != NULL)
    return dfa;

  MutexLock l(&dfa_mutex_);
  dfa = pdfa->load(std::memory_order_relaxed);
  if (dfa != NULL)
    return dfa;

  // For a forward DFA, half the memory goes to each DFA.
  // For a reverse DFA, all the memory goes to the
  // "longest match" DFA, because RE2 never does reverse
  // "first match" searches.
  int64 m = dfa_mem_/2;
  if (reversed_) {
    if (kind == kLongestMatch || kind == kManyMatch)
      m = dfa_mem_;
    else
      m = 0;
  }
  dfa = new DFA(this, kind, m);

  // Synchronize with "quick check" above.
  pdfa->store(dfa, std::memory_order_release);
  return dfa;
}